

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O1

type_conflict2
std::__detail::__variant::
__gen_vtable_impl<std::__detail::__variant::_Multi_array<std::__detail::__variant::__deduce_visit_result<int>_(*)((lambda_at_/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/build_O1/_deps/libtrackerboy-src/src/export/Player.cpp:90:23)_&&,_const_std::variant<std::monostate,_trackerboy::Player::LoopContext,_trackerboy::Player::DurationContext>_&)>,_std::integer_sequence<unsigned_long,_1UL>_>
::__visit_invoke(anon_class_1_0_00000001 *__visitor,
                variant<std::monostate,_trackerboy::Player::LoopContext,_trackerboy::Player::DurationContext>
                *__vars)

{
  return *(type_conflict2 *)
          ((long)&(__vars->
                  super__Variant_base<std::monostate,_trackerboy::Player::LoopContext,_trackerboy::Player::DurationContext>
                  ).
                  super__Move_assign_alias<std::monostate,_trackerboy::Player::LoopContext,_trackerboy::Player::DurationContext>
                  .
                  super__Copy_assign_alias<std::monostate,_trackerboy::Player::LoopContext,_trackerboy::Player::DurationContext>
                  .
                  super__Move_ctor_alias<std::monostate,_trackerboy::Player::LoopContext,_trackerboy::Player::DurationContext>
                  .
                  super__Copy_ctor_alias<std::monostate,_trackerboy::Player::LoopContext,_trackerboy::Player::DurationContext>
                  .
                  super__Variant_storage_alias<std::monostate,_trackerboy::Player::LoopContext,_trackerboy::Player::DurationContext>
                  ._M_u + 0x20);
}

Assistant:

int Player::progressMax() const {
    return std::visit([](auto&& ctx) {
        using T = std::decay_t<decltype(ctx)>;

        if constexpr (std::is_same_v<T, LoopContext>) {
            return ctx.loopAmount;
        } else if constexpr (std::is_same_v<T, DurationContext>) {
            return ctx.framesToPlay;
        } else {
            return 0;
        }
    }, mContext);
}